

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterNew(Fts5Index *p,Fts5Structure *pStruct,int flags,Fts5Colset *pColset,u8 *pTerm,
                     int nTerm,int iLevel,int nSegment,Fts5Iter **ppOut)

{
  int iVar1;
  Fts5Iter *pIter_00;
  Fts5StructureSegment *pSeg_00;
  bool bVar2;
  int local_8c;
  Fts5SegIter *pSeg_2;
  Fts5SegIter *pSeg_1;
  int iEq;
  Fts5SegIter *pIter_1;
  Fts5StructureSegment *pSeg;
  Fts5SegIter *pIter;
  Fts5StructureLevel *pEnd;
  Fts5Iter *pNew;
  Fts5StructureLevel *pLvl;
  int iSeg;
  int iIter;
  int nSeg;
  int nTerm_local;
  u8 *pTerm_local;
  Fts5Colset *pColset_local;
  int flags_local;
  Fts5Structure *pStruct_local;
  Fts5Index *p_local;
  
  iSeg = 0;
  pLvl._4_4_ = 0;
  if (p->rc == 0) {
    if (iLevel < 0) {
      iSeg = (uint)(p->pHash != (Fts5Hash *)0x0) + pStruct->nSegment;
    }
    else {
      if (pStruct->aLevel[iLevel].nSeg < nSegment) {
        local_8c = pStruct->aLevel[iLevel].nSeg;
      }
      else {
        local_8c = nSegment;
      }
      iSeg = local_8c;
    }
  }
  pIter_00 = fts5MultiIterAlloc(p,iSeg);
  *ppOut = pIter_00;
  if (pIter_00 != (Fts5Iter *)0x0) {
    pIter_00->bRev = (uint)((flags & 2U) != 0);
    pIter_00->bSkipEmpty = (flags & 0x10U) != 0;
    pIter_00->pColset = pColset;
    if ((flags & 0x20U) == 0) {
      fts5IterSetOutputCb(&p->rc,pIter_00);
    }
    if (p->rc == 0) {
      if (iLevel < 0) {
        iVar1 = pStruct->nLevel;
        bVar2 = p->pHash != (Fts5Hash *)0x0;
        if (bVar2) {
          fts5SegIterHashInit(p,pTerm,nTerm,flags,pIter_00->aSeg);
        }
        pLvl._4_4_ = (uint)bVar2;
        for (pNew = (Fts5Iter *)pStruct->aLevel; pNew < (Fts5Iter *)(pStruct->aLevel + iVar1);
            pNew = (Fts5Iter *)&(pNew->base).nData) {
          pLvl._0_4_ = *(int *)((long)&(pNew->base).iRowid + 4);
          while (pLvl._0_4_ = (int)pLvl + -1, -1 < (int)pLvl) {
            pSeg_00 = (Fts5StructureSegment *)((pNew->base).pData + (long)(int)pLvl * 0xc);
            if (pTerm == (u8 *)0x0) {
              fts5SegIterInit(p,pSeg_00,pIter_00->aSeg + (int)pLvl._4_4_);
              pLvl._4_4_ = pLvl._4_4_ + 1;
            }
            else {
              fts5SegIterSeekInit(p,pTerm,nTerm,flags,pSeg_00,pIter_00->aSeg + (int)pLvl._4_4_);
              pLvl._4_4_ = pLvl._4_4_ + 1;
            }
          }
        }
      }
      else {
        while (pLvl._0_4_ = iSeg + -1, -1 < (int)pLvl) {
          fts5SegIterInit(p,pStruct->aLevel[iLevel].aSeg + (int)pLvl,
                          pIter_00->aSeg + (int)pLvl._4_4_);
          pLvl._4_4_ = pLvl._4_4_ + 1;
          iSeg = (int)pLvl;
        }
      }
    }
    if (p->rc == 0) {
      pLvl._4_4_ = pIter_00->nSeg;
      while (pLvl._4_4_ = pLvl._4_4_ + -1, 0 < (int)pLvl._4_4_) {
        iVar1 = fts5MultiIterDoCompare(pIter_00,pLvl._4_4_);
        if (iVar1 != 0) {
          if (p->rc == 0) {
            (*pIter_00->aSeg[iVar1].xNext)(p,pIter_00->aSeg + iVar1,(int *)0x0);
          }
          fts5MultiIterAdvanced(p,pIter_00,iVar1,pLvl._4_4_);
        }
      }
      fts5MultiIterSetEof(pIter_00);
      if ((pIter_00->bSkipEmpty == '\0') || (iVar1 = fts5MultiIterIsEmpty(p,pIter_00), iVar1 == 0))
      {
        if ((pIter_00->base).bEof == '\0') {
          (*pIter_00->xSetOutputs)(pIter_00,pIter_00->aSeg + pIter_00->aFirst[1].iFirst);
        }
      }
      else {
        fts5MultiIterNext(p,pIter_00,0,0);
      }
    }
    else {
      fts5MultiIterFree(pIter_00);
      *ppOut = (Fts5Iter *)0x0;
    }
  }
  return;
}

Assistant:

static void fts5MultiIterNew(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Structure *pStruct,         /* Structure of specific index */
  int flags,                      /* FTS5INDEX_QUERY_XXX flags */
  Fts5Colset *pColset,            /* Colset to filter on (or NULL) */
  const u8 *pTerm, int nTerm,     /* Term to seek to (or NULL/0) */
  int iLevel,                     /* Level to iterate (-1 for all) */
  int nSegment,                   /* Number of segments to merge (iLevel>=0) */
  Fts5Iter **ppOut                /* New object */
){
  int nSeg = 0;                   /* Number of segment-iters in use */
  int iIter = 0;                  /* */
  int iSeg;                       /* Used to iterate through segments */
  Fts5StructureLevel *pLvl;
  Fts5Iter *pNew;

  assert( (pTerm==0 && nTerm==0) || iLevel<0 );

  /* Allocate space for the new multi-seg-iterator. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      assert( pStruct->nSegment==fts5StructureCountSegments(pStruct) );
      nSeg = pStruct->nSegment;
      nSeg += (p->pHash ? 1 : 0);
    }else{
      nSeg = MIN(pStruct->aLevel[iLevel].nSeg, nSegment);
    }
  }
  *ppOut = pNew = fts5MultiIterAlloc(p, nSeg);
  if( pNew==0 ) return;
  pNew->bRev = (0!=(flags & FTS5INDEX_QUERY_DESC));
  pNew->bSkipEmpty = (0!=(flags & FTS5INDEX_QUERY_SKIPEMPTY));
  pNew->pColset = pColset;
  if( (flags & FTS5INDEX_QUERY_NOOUTPUT)==0 ){
    fts5IterSetOutputCb(&p->rc, pNew);
  }

  /* Initialize each of the component segment iterators. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      Fts5StructureLevel *pEnd = &pStruct->aLevel[pStruct->nLevel];
      if( p->pHash ){
        /* Add a segment iterator for the current contents of the hash table. */
        Fts5SegIter *pIter = &pNew->aSeg[iIter++];
        fts5SegIterHashInit(p, pTerm, nTerm, flags, pIter);
      }
      for(pLvl=&pStruct->aLevel[0]; pLvl<pEnd; pLvl++){
        for(iSeg=pLvl->nSeg-1; iSeg>=0; iSeg--){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          Fts5SegIter *pIter = &pNew->aSeg[iIter++];
          if( pTerm==0 ){
            fts5SegIterInit(p, pSeg, pIter);
          }else{
            fts5SegIterSeekInit(p, pTerm, nTerm, flags, pSeg, pIter);
          }
        }
      }
    }else{
      pLvl = &pStruct->aLevel[iLevel];
      for(iSeg=nSeg-1; iSeg>=0; iSeg--){
        fts5SegIterInit(p, &pLvl->aSeg[iSeg], &pNew->aSeg[iIter++]);
      }
    }
    assert( iIter==nSeg );
  }

  /* If the above was successful, each component iterators now points 
  ** to the first entry in its segment. In this case initialize the 
  ** aFirst[] array. Or, if an error has occurred, free the iterator
  ** object and set the output variable to NULL.  */
  if( p->rc==SQLITE_OK ){
    for(iIter=pNew->nSeg-1; iIter>0; iIter--){
      int iEq;
      if( (iEq = fts5MultiIterDoCompare(pNew, iIter)) ){
        Fts5SegIter *pSeg = &pNew->aSeg[iEq];
        if( p->rc==SQLITE_OK ) pSeg->xNext(p, pSeg, 0);
        fts5MultiIterAdvanced(p, pNew, iEq, iIter);
      }
    }
    fts5MultiIterSetEof(pNew);
    fts5AssertMultiIterSetup(p, pNew);

    if( pNew->bSkipEmpty && fts5MultiIterIsEmpty(p, pNew) ){
      fts5MultiIterNext(p, pNew, 0, 0);
    }else if( pNew->base.bEof==0 ){
      Fts5SegIter *pSeg = &pNew->aSeg[pNew->aFirst[1].iFirst];
      pNew->xSetOutputs(pNew, pSeg);
    }

  }else{
    fts5MultiIterFree(pNew);
    *ppOut = 0;
  }
}